

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_functions.cpp
# Opt level: O1

Value * duckdb::FunctionStabilityToValue(Value *__return_storage_ptr__,FunctionStability stability)

{
  InternalException *this;
  string local_40;
  
  if (stability < (CONSISTENT_WITHIN_QUERY|VOLATILE)) {
    Value::Value(__return_storage_ptr__,
                 &DAT_013a15b4 + *(int *)(&DAT_013a15b4 + (ulong)stability * 4));
    return __return_storage_ptr__;
  }
  this = (InternalException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Unsupported FunctionStability","");
  InternalException::InternalException(this,&local_40);
  __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

Value FunctionStabilityToValue(FunctionStability stability) {
	switch (stability) {
	case FunctionStability::VOLATILE:
		return Value("VOLATILE");
	case FunctionStability::CONSISTENT:
		return Value("CONSISTENT");
	case FunctionStability::CONSISTENT_WITHIN_QUERY:
		return Value("CONSISTENT_WITHIN_QUERY");
	default:
		throw InternalException("Unsupported FunctionStability");
	}
}